

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac *pFlac)

{
  short sVar1;
  undefined8 uVar2;
  uint uVar3;
  ma_bool32 mVar4;
  long in_RDI;
  ulong uVar5;
  ma_uint8 padding;
  ma_uint16 actualCRC16;
  ma_uint16 desiredCRC16;
  ma_uint8 paddingSizeInBits;
  int i;
  int channelCount;
  ma_uint8 lookup [11];
  ma_uint16 *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff3c;
  uint bitCount;
  int iVar6;
  undefined4 in_stack_ffffffffffffff50;
  ma_result mVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined2 uVar10;
  undefined1 uVar11;
  char cVar12;
  ushort local_76;
  ushort local_62;
  
  memset((void *)(in_RDI + 0x68),0,0x80);
  if (*(ushort *)(in_RDI + 0x36) < *(ushort *)(in_RDI + 0x58)) {
    mVar7 = MA_ERROR;
  }
  else {
    cVar12 = *(char *)(in_RDI + 0x5a);
    uVar8 = 0x4030201;
    uVar9 = 0x8070605;
    uVar10 = 0x202;
    uVar11 = 2;
    uVar3 = (uint)(byte)(&stack0xffffffffffffff54)[cVar12];
    if (uVar3 == *(byte *)(in_RDI + 0x34)) {
      for (iVar6 = 0; iVar6 < (int)uVar3; iVar6 = iVar6 + 1) {
        mVar4 = ma_dr_flac__decode_subframe
                          ((ma_dr_flac_bs *)CONCAT17(cVar12,CONCAT16(uVar11,CONCAT24(uVar10,uVar9)))
                           ,(ma_dr_flac_frame *)CONCAT44(uVar8,in_stack_ffffffffffffff50),
                           (int)((ulong)in_RDI >> 0x20),(ma_int32 *)CONCAT44(uVar3,iVar6));
        if (mVar4 == 0) {
          return MA_ERROR;
        }
      }
      bitCount = CONCAT13('@' - (char)*(undefined4 *)(in_RDI + 0x15c),
                          (int3)in_stack_ffffffffffffff3c) & 0x7ffffff;
      if (((char)(bitCount >> 0x18) == '\0') ||
         (mVar4 = ma_dr_flac__read_uint8
                            ((ma_dr_flac_bs *)CONCAT44(uVar3,iVar6),bitCount,
                             (ma_uint8 *)in_stack_ffffffffffffff30), mVar4 != 0)) {
        if (*(int *)(in_RDI + 0x15c) == 0x40) {
          if (*(int *)(in_RDI + 0x1178) == 0) {
            uVar2 = *(undefined8 *)(in_RDI + 0x1170);
            *(ma_uint16 *)(in_RDI + 0x1168) =
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                            [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                       [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))] <<
                                                  8 ^ ma_dr_flac__crc16_table
                                                      [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                  (in_RDI + 0x1168)
                                                                                 << 8 ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))] << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                      [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x1168) >> 8
                                                                ^ (uint)(byte)((ulong)uVar2 >> 0x38)
                                                                )] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))]) >> 8 ^
                                                 (uint)(byte)((ulong)uVar2 >> 0x10))]) >> 8 ^
                       (uint)(byte)((ulong)uVar2 >> 8))] << 8 ^
                 ma_dr_flac__crc16_table
                 [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                            [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                       [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x1168) >> 8
                                                                ^ (uint)(byte)((ulong)uVar2 >> 0x38)
                                                                )] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x10))] << 8 ^
                                           ma_dr_flac__crc16_table
                                           [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                      [(int)((int)(uint)(ushort)(
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                      (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(ma_dr_flac__crc16_table
                                                          [(int)((int)(uint)*(ushort *)
                                                                             (in_RDI + 0x1168) >> 8
                                                                ^ (uint)(byte)((ulong)uVar2 >> 0x38)
                                                                )] << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)(ushort)(*(ushort *)
                                                                                     (in_RDI + 
                                                  0x1168) << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)(
                                                  ushort)(*(ushort *)(in_RDI + 0x1168) << 8 ^
                                                         ma_dr_flac__crc16_table
                                                         [(int)((int)(uint)*(ushort *)
                                                                            (in_RDI + 0x1168) >> 8 ^
                                                               (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(ma_dr_flac__crc16_table
                                                                             [(int)((int)(uint)*(
                                                  ushort *)(in_RDI + 0x1168) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x38))] << 8 ^
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)(ushort)(*(ushort *)
                                                                              (in_RDI + 0x1168) << 8
                                                                            ^ 
                                                  ma_dr_flac__crc16_table
                                                  [(int)((int)(uint)*(ushort *)(in_RDI + 0x1168) >>
                                                         8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))])
                                                  >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))]) >> 8
                                                  ^ (uint)(byte)((ulong)uVar2 >> 0x28))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x20))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x18))]) >> 8 ^
                                                  (uint)(byte)((ulong)uVar2 >> 0x10))]) >> 8 ^
                                                 (uint)(byte)((ulong)uVar2 >> 8))]) >> 8 ^
                       (uint)(byte)uVar2)];
          }
          else {
            local_76 = *(ushort *)(in_RDI + 0x1168);
            uVar2 = *(undefined8 *)(in_RDI + 0x1170);
            in_stack_ffffffffffffff30 = (ma_uint16 *)(ulong)(7 - *(int *)(in_RDI + 0x1178));
            switch(in_stack_ffffffffffffff30) {
            case (ma_uint16 *)0x7:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x38))];
            case (ma_uint16 *)0x6:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x30))];
            case (ma_uint16 *)0x5:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x28))];
            case (ma_uint16 *)0x4:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x20))];
            case (ma_uint16 *)0x3:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x18))];
            case (ma_uint16 *)0x2:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 0x10))];
            case (ma_uint16 *)0x1:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)((ulong)uVar2 >> 8))];
            case (ma_uint16 *)0x0:
              local_76 = local_76 << 8 ^
                         ma_dr_flac__crc16_table
                         [(int)((int)(uint)local_76 >> 8 ^ (uint)(byte)uVar2)];
            default:
              *(ushort *)(in_RDI + 0x1168) = local_76;
              *(undefined4 *)(in_RDI + 0x1178) = 0;
            }
          }
        }
        else {
          local_62 = *(ushort *)(in_RDI + 0x1168);
          uVar5 = *(ulong *)(in_RDI + 0x1170) >> (-(char)*(uint *)(in_RDI + 0x15c) & 0x3fU);
          switch((*(uint *)(in_RDI + 0x15c) >> 3) - *(int *)(in_RDI + 0x1178)) {
          case 8:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 0x38))];
          case 7:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 0x30))];
          case 6:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 0x28))];
          case 5:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 0x20))];
          case 4:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 0x18))];
          case 3:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 0x10))];
          case 2:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table
                       [(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)(uVar5 >> 8))];
          case 1:
            local_62 = local_62 << 8 ^
                       ma_dr_flac__crc16_table[(int)((int)(uint)local_62 >> 8 ^ (uint)(byte)uVar5)];
          default:
            *(ushort *)(in_RDI + 0x1168) = local_62;
            *(uint *)(in_RDI + 0x1178) = *(uint *)(in_RDI + 0x15c) >> 3;
          }
        }
        sVar1 = *(short *)(in_RDI + 0x1168);
        mVar4 = ma_dr_flac__read_uint16
                          ((ma_dr_flac_bs *)CONCAT44(uVar3,iVar6),bitCount,in_stack_ffffffffffffff30
                          );
        if (mVar4 == 0) {
          mVar7 = MA_AT_END;
        }
        else if (sVar1 == (short)bitCount) {
          *(uint *)(in_RDI + 0x60) = (uint)*(ushort *)(in_RDI + 0x58);
          mVar7 = MA_SUCCESS;
        }
        else {
          mVar7 = MA_CRC_MISMATCH;
        }
      }
      else {
        mVar7 = MA_AT_END;
      }
    }
    else {
      mVar7 = MA_ERROR;
    }
  }
  return mVar7;
}

Assistant:

static ma_result ma_dr_flac__decode_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint8 paddingSizeInBits;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    MA_DR_FLAC_ZERO_MEMORY(pFlac->currentFLACFrame.subframes, sizeof(pFlac->currentFLACFrame.subframes));
    if (pFlac->currentFLACFrame.header.blockSizeInPCMFrames > pFlac->maxBlockSizeInPCMFrames) {
        return MA_ERROR;
    }
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    if (channelCount != (int)pFlac->channels) {
        return MA_ERROR;
    }
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__decode_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i, pFlac->pDecodedSamples + (pFlac->currentFLACFrame.header.blockSizeInPCMFrames * i))) {
            return MA_ERROR;
        }
    }
    paddingSizeInBits = (ma_uint8)(MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7);
    if (paddingSizeInBits > 0) {
        ma_uint8 padding = 0;
        if (!ma_dr_flac__read_uint8(&pFlac->bs, paddingSizeInBits, &padding)) {
            return MA_AT_END;
        }
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    pFlac->currentFLACFrame.pcmFramesRemaining = pFlac->currentFLACFrame.header.blockSizeInPCMFrames;
    return MA_SUCCESS;
}